

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O2

void sysbvm_jit_moveRegisterToOperand
               (sysbvm_bytecodeJit_t *jit,int16_t operand,sysbvm_x86_register_t reg)

{
  ulong uVar1;
  undefined6 in_register_00000032;
  
  uVar1 = CONCAT62(in_register_00000032,operand) >> 2;
  if ((short)uVar1 < 0) {
    return;
  }
  if ((~(uint)CONCAT62(in_register_00000032,operand) & 3) == 0) {
    sysbvm_jit_x86_mov64IntoMemoryWithOffset
              (jit,SYSBVM_X86_EBP,((uint)uVar1 & 0xffff) * 8 + jit->localVectorOffset,
               SYSBVM_X86_64_CALL_SHADOW_SPACE);
    return;
  }
  abort();
}

Assistant:

static void sysbvm_jit_moveRegisterToOperand(sysbvm_bytecodeJit_t *jit, int16_t operand, sysbvm_x86_register_t reg)
{
    sysbvm_operandVectorName_t vectorType = (sysbvm_operandVectorName_t) (operand & SYSBVM_OPERAND_VECTOR_BITMASK);
    int16_t vectorIndex = operand >> SYSBVM_OPERAND_VECTOR_BITS;
    if(vectorIndex < 0)
        return;

    int32_t vectorOffset = vectorIndex * sizeof(void*);
    switch(vectorType)
    {
    case SYSBVM_OPERAND_VECTOR_LOCAL:
        sysbvm_jit_x86_mov64IntoMemoryWithOffset(jit, SYSBVM_X86_RBP, jit->localVectorOffset + vectorOffset, reg);
        break;
    default:
        abort();
        break;
    }
}